

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  uint64_t uVar191;
  uint64_t uVar192;
  uint64_t uVar193;
  ulong uVar194;
  ulong uVar195;
  ulong uVar196;
  ulong uVar197;
  ulong uVar198;
  secp256k1_fe *psVar199;
  size_t sVar200;
  int *piVar201;
  secp256k1_ge *psVar202;
  secp256k1_ge *psVar203;
  ulong uVar204;
  ulong uVar205;
  ulong uVar206;
  ulong uVar207;
  size_t sVar208;
  uint64_t tmp3;
  uint64_t tmp2;
  secp256k1_fe u;
  uint64_t tmp3_1;
  secp256k1_fe local_60;
  ulong local_38;
  
  if (len != 0) {
    psVar199 = &a->z;
    sVar208 = 0xffffffffffffffff;
    sVar200 = 0;
    psVar203 = r;
    do {
      if (*(int *)(psVar199 + 1) == 0) {
        if (sVar208 == 0xffffffffffffffff) {
          (psVar203->x).n[4] = psVar199->n[4];
          uVar191 = psVar199->n[0];
          uVar192 = psVar199->n[1];
          uVar193 = psVar199->n[3];
          (psVar203->x).n[2] = psVar199->n[2];
          (psVar203->x).n[3] = uVar193;
          (psVar203->x).n[0] = uVar191;
          (psVar203->x).n[1] = uVar192;
          sVar208 = sVar200;
        }
        else {
          psVar202 = r + sVar208;
          uVar197 = (psVar202->x).n[0];
          uVar205 = (psVar202->x).n[1];
          uVar198 = (psVar202->x).n[2];
          uVar206 = (psVar202->x).n[3];
          uVar207 = (psVar202->x).n[4];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = psVar199->n[0];
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar206;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = psVar199->n[1];
          auVar93._8_8_ = 0;
          auVar93._0_8_ = uVar198;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = psVar199->n[2];
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar205;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = psVar199->n[3];
          auVar95._8_8_ = 0;
          auVar95._0_8_ = uVar197;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = psVar199->n[4];
          auVar96._8_8_ = 0;
          auVar96._0_8_ = uVar207;
          uVar194 = SUB168(auVar6 * auVar96,0);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar194 & 0xfffffffffffff;
          auVar2 = auVar3 * auVar93 + auVar2 * auVar92 + auVar4 * auVar94 + auVar5 * auVar95 +
                   auVar7 * ZEXT816(0x1000003d10);
          uVar195 = auVar2._0_8_;
          local_60.n[0] = uVar195 & 0xfffffffffffff;
          auVar170._8_8_ = 0;
          auVar170._0_8_ = uVar195 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = psVar199->n[0];
          auVar97._8_8_ = 0;
          auVar97._0_8_ = uVar207;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = psVar199->n[1];
          auVar98._8_8_ = 0;
          auVar98._0_8_ = uVar206;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = psVar199->n[2];
          auVar99._8_8_ = 0;
          auVar99._0_8_ = uVar198;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = psVar199->n[3];
          auVar100._8_8_ = 0;
          auVar100._0_8_ = uVar205;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = psVar199->n[4];
          auVar101._8_8_ = 0;
          auVar101._0_8_ = uVar197;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = uVar194 >> 0x34 | SUB168(auVar6 * auVar96,8) << 0xc;
          auVar2 = auVar8 * auVar97 + auVar170 + auVar9 * auVar98 + auVar10 * auVar99 +
                   auVar11 * auVar100 + auVar12 * auVar101 + auVar13 * ZEXT816(0x1000003d10);
          uVar194 = auVar2._0_8_;
          auVar171._8_8_ = 0;
          auVar171._0_8_ = uVar194 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = psVar199->n[0];
          auVar102._8_8_ = 0;
          auVar102._0_8_ = uVar197;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = psVar199->n[1];
          auVar103._8_8_ = 0;
          auVar103._0_8_ = uVar207;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = psVar199->n[2];
          auVar104._8_8_ = 0;
          auVar104._0_8_ = uVar206;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = psVar199->n[3];
          auVar105._8_8_ = 0;
          auVar105._0_8_ = uVar198;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = psVar199->n[4];
          auVar106._8_8_ = 0;
          auVar106._0_8_ = uVar205;
          auVar2 = auVar15 * auVar103 + auVar171 + auVar16 * auVar104 + auVar17 * auVar105 +
                   auVar18 * auVar106;
          uVar195 = auVar2._0_8_;
          auVar173._8_8_ = 0;
          auVar173._0_8_ = uVar195 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar107._8_8_ = 0;
          auVar107._0_8_ = (uVar195 & 0xfffffffffffff) << 4 | (uVar194 & 0xfffffffffffff) >> 0x30;
          uVar195 = auVar32._0_8_;
          auVar32 = auVar14 * auVar102 + ZEXT816(0x1000003d1) * auVar107;
          (psVar203->x).n[0] = uVar195 & 0xfffffffffffff;
          auVar172._8_8_ = 0;
          auVar172._0_8_ = uVar195 >> 0x34 | auVar32._8_8_ << 0xc;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = psVar199->n[0];
          auVar108._8_8_ = 0;
          auVar108._0_8_ = uVar205;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = psVar199->n[1];
          auVar109._8_8_ = 0;
          auVar109._0_8_ = uVar197;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = psVar199->n[2];
          auVar110._8_8_ = 0;
          auVar110._0_8_ = uVar207;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = psVar199->n[3];
          auVar111._8_8_ = 0;
          auVar111._0_8_ = uVar206;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = psVar199->n[4];
          auVar112._8_8_ = 0;
          auVar112._0_8_ = uVar198;
          auVar3 = auVar21 * auVar110 + auVar173 + auVar22 * auVar111 + auVar23 * auVar112;
          uVar195 = auVar3._0_8_;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar195 & 0xfffffffffffff;
          auVar2 = auVar19 * auVar108 + auVar172 + auVar20 * auVar109 +
                   auVar24 * ZEXT816(0x1000003d10);
          uVar196 = auVar2._0_8_;
          auVar175._8_8_ = 0;
          auVar175._0_8_ = uVar195 >> 0x34 | auVar3._8_8_ << 0xc;
          (psVar203->x).n[1] = uVar196 & 0xfffffffffffff;
          auVar174._8_8_ = 0;
          auVar174._0_8_ = uVar196 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = psVar199->n[0];
          auVar113._8_8_ = 0;
          auVar113._0_8_ = uVar198;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = psVar199->n[1];
          auVar114._8_8_ = 0;
          auVar114._0_8_ = uVar205;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = psVar199->n[2];
          auVar115._8_8_ = 0;
          auVar115._0_8_ = uVar197;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = psVar199->n[3];
          auVar116._8_8_ = 0;
          auVar116._0_8_ = uVar207;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = psVar199->n[4];
          auVar117._8_8_ = 0;
          auVar117._0_8_ = uVar206;
          auVar3 = auVar28 * auVar116 + auVar175 + auVar29 * auVar117;
          uVar197 = auVar3._0_8_;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar197 & 0xfffffffffffff;
          auVar2 = auVar25 * auVar113 + auVar174 + auVar26 * auVar114 + auVar27 * auVar115 +
                   auVar30 * ZEXT816(0x1000003d10);
          uVar205 = auVar2._0_8_;
          (psVar203->x).n[2] = uVar205 & 0xfffffffffffff;
          auVar176._8_8_ = 0;
          auVar176._0_8_ = (uVar205 >> 0x34 | auVar2._8_8_ << 0xc) + local_60.n[0];
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar197 >> 0x34 | auVar3._8_8_ << 0xc;
          auVar176 = auVar31 * ZEXT816(0x1000003d10) + auVar176;
          uVar197 = auVar176._0_8_;
          (psVar203->x).n[3] = uVar197 & 0xfffffffffffff;
          (psVar203->x).n[4] =
               (uVar197 >> 0x34 | auVar176._8_8_ << 0xc) + (uVar194 & 0xffffffffffff);
          sVar208 = sVar200;
        }
      }
      else {
        psVar203->infinity = 1;
        (psVar203->x).n[0] = 0;
        (psVar203->x).n[1] = 0;
        (psVar203->x).n[2] = 0;
        (psVar203->x).n[3] = 0;
        (psVar203->x).n[4] = 0;
        (psVar203->y).n[0] = 0;
        (psVar203->y).n[1] = 0;
        (psVar203->y).n[2] = 0;
        (psVar203->y).n[3] = 0;
        (psVar203->y).n[4] = 0;
      }
      sVar200 = sVar200 + 1;
      psVar203 = psVar203 + 1;
      psVar199 = (secp256k1_fe *)((long)(psVar199 + 3) + 8);
    } while (len != sVar200);
    if (sVar208 != 0xffffffffffffffff) {
      secp256k1_fe_impl_inv_var(&local_60,&r[sVar208].x);
      if (sVar208 == 0) {
        (r->x).n[4] = local_60.n[4];
        (r->x).n[2] = local_60.n[2];
        (r->x).n[3] = local_60.n[3];
        (r->x).n[0] = local_60.n[0];
        (r->x).n[1] = local_60.n[1];
      }
      else {
        piVar201 = &a[sVar208 - 1].infinity;
        psVar203 = r + sVar208;
        sVar200 = sVar208;
        do {
          sVar200 = sVar200 - 1;
          if (*piVar201 == 0) {
            psVar202 = r + sVar208;
            uVar197 = psVar203[-1].x.n[0];
            uVar205 = psVar203[-1].x.n[1];
            uVar198 = psVar203[-1].x.n[2];
            uVar206 = psVar203[-1].x.n[3];
            uVar207 = psVar203[-1].x.n[4];
            auVar32._8_8_ = 0;
            auVar32._0_8_ = local_60.n[0];
            auVar118._8_8_ = 0;
            auVar118._0_8_ = uVar206;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = local_60.n[1];
            auVar119._8_8_ = 0;
            auVar119._0_8_ = uVar198;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = local_60.n[2];
            auVar120._8_8_ = 0;
            auVar120._0_8_ = uVar205;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = local_60.n[3];
            auVar121._8_8_ = 0;
            auVar121._0_8_ = uVar197;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = local_60.n[4];
            auVar122._8_8_ = 0;
            auVar122._0_8_ = uVar207;
            uVar194 = SUB168(auVar36 * auVar122,0);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar194 & 0xfffffffffffff;
            auVar32 = auVar33 * auVar119 + auVar32 * auVar118 + auVar34 * auVar120 +
                      auVar35 * auVar121 + auVar37 * ZEXT816(0x1000003d10);
            uVar195 = auVar32._0_8_;
            auVar177._8_8_ = 0;
            auVar177._0_8_ = uVar195 >> 0x34 | auVar32._8_8_ << 0xc;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = local_60.n[0];
            auVar123._8_8_ = 0;
            auVar123._0_8_ = uVar207;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = local_60.n[1];
            auVar124._8_8_ = 0;
            auVar124._0_8_ = uVar206;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = local_60.n[2];
            auVar125._8_8_ = 0;
            auVar125._0_8_ = uVar198;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = local_60.n[3];
            auVar126._8_8_ = 0;
            auVar126._0_8_ = uVar205;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = local_60.n[4];
            auVar127._8_8_ = 0;
            auVar127._0_8_ = uVar197;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar194 >> 0x34 | SUB168(auVar36 * auVar122,8) << 0xc;
            auVar32 = auVar38 * auVar123 + auVar177 + auVar39 * auVar124 + auVar40 * auVar125 +
                      auVar41 * auVar126 + auVar42 * auVar127 + auVar43 * ZEXT816(0x1000003d10);
            uVar194 = auVar32._0_8_;
            auVar178._8_8_ = 0;
            auVar178._0_8_ = uVar194 >> 0x34 | auVar32._8_8_ << 0xc;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = local_60.n[0];
            auVar128._8_8_ = 0;
            auVar128._0_8_ = uVar197;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = local_60.n[1];
            auVar129._8_8_ = 0;
            auVar129._0_8_ = uVar207;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = local_60.n[2];
            auVar130._8_8_ = 0;
            auVar130._0_8_ = uVar206;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = local_60.n[3];
            auVar131._8_8_ = 0;
            auVar131._0_8_ = uVar198;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = local_60.n[4];
            auVar132._8_8_ = 0;
            auVar132._0_8_ = uVar205;
            auVar32 = auVar45 * auVar129 + auVar178 + auVar46 * auVar130 + auVar47 * auVar131 +
                      auVar48 * auVar132;
            uVar196 = auVar32._0_8_;
            auVar180._8_8_ = 0;
            auVar180._0_8_ = uVar196 >> 0x34 | auVar32._8_8_ << 0xc;
            auVar133._8_8_ = 0;
            auVar133._0_8_ = (uVar196 & 0xfffffffffffff) << 4 | (uVar194 & 0xfffffffffffff) >> 0x30;
            auVar32 = auVar44 * auVar128 + ZEXT816(0x1000003d1) * auVar133;
            uVar196 = auVar32._0_8_;
            (psVar202->x).n[0] = uVar196 & 0xfffffffffffff;
            auVar179._8_8_ = 0;
            auVar179._0_8_ = uVar196 >> 0x34 | auVar32._8_8_ << 0xc;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = local_60.n[0];
            auVar134._8_8_ = 0;
            auVar134._0_8_ = uVar205;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = local_60.n[1];
            auVar135._8_8_ = 0;
            auVar135._0_8_ = uVar197;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = local_60.n[2];
            auVar136._8_8_ = 0;
            auVar136._0_8_ = uVar207;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = local_60.n[3];
            auVar137._8_8_ = 0;
            auVar137._0_8_ = uVar206;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = local_60.n[4];
            auVar138._8_8_ = 0;
            auVar138._0_8_ = uVar198;
            auVar2 = auVar51 * auVar136 + auVar180 + auVar52 * auVar137 + auVar53 * auVar138;
            uVar196 = auVar2._0_8_;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = uVar196 & 0xfffffffffffff;
            auVar32 = auVar49 * auVar134 + auVar179 + auVar50 * auVar135 +
                      auVar54 * ZEXT816(0x1000003d10);
            uVar204 = auVar32._0_8_;
            auVar182._8_8_ = 0;
            auVar182._0_8_ = uVar196 >> 0x34 | auVar2._8_8_ << 0xc;
            (psVar202->x).n[1] = uVar204 & 0xfffffffffffff;
            auVar181._8_8_ = 0;
            auVar181._0_8_ = uVar204 >> 0x34 | auVar32._8_8_ << 0xc;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = local_60.n[0];
            auVar139._8_8_ = 0;
            auVar139._0_8_ = uVar198;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = local_60.n[1];
            auVar140._8_8_ = 0;
            auVar140._0_8_ = uVar205;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = local_60.n[2];
            auVar141._8_8_ = 0;
            auVar141._0_8_ = uVar197;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = local_60.n[3];
            auVar142._8_8_ = 0;
            auVar142._0_8_ = uVar207;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = local_60.n[4];
            auVar143._8_8_ = 0;
            auVar143._0_8_ = uVar206;
            auVar2 = auVar58 * auVar142 + auVar182 + auVar59 * auVar143;
            uVar197 = auVar2._0_8_;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = uVar197 & 0xfffffffffffff;
            auVar32 = auVar55 * auVar139 + auVar181 + auVar56 * auVar140 + auVar57 * auVar141 +
                      auVar60 * ZEXT816(0x1000003d10);
            uVar205 = auVar32._0_8_;
            (psVar202->x).n[2] = uVar205 & 0xfffffffffffff;
            auVar183._8_8_ = 0;
            auVar183._0_8_ = (uVar205 >> 0x34 | auVar32._8_8_ << 0xc) + (uVar195 & 0xfffffffffffff);
            auVar61._8_8_ = 0;
            auVar61._0_8_ = uVar197 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar183 = auVar61 * ZEXT816(0x1000003d10) + auVar183;
            uVar197 = auVar183._0_8_;
            (psVar202->x).n[3] = uVar197 & 0xfffffffffffff;
            (psVar202->x).n[4] =
                 (uVar197 >> 0x34 | auVar183._8_8_ << 0xc) + (uVar194 & 0xffffffffffff);
            psVar199 = &a[sVar208].z;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = psVar199->n[0];
            auVar144._8_8_ = 0;
            auVar144._0_8_ = local_60.n[3];
            auVar63._8_8_ = 0;
            auVar63._0_8_ = a[sVar208].z.n[1];
            auVar145._8_8_ = 0;
            auVar145._0_8_ = local_60.n[2];
            auVar64._8_8_ = 0;
            auVar64._0_8_ = a[sVar208].z.n[2];
            auVar146._8_8_ = 0;
            auVar146._0_8_ = local_60.n[1];
            auVar65._8_8_ = 0;
            auVar65._0_8_ = a[sVar208].z.n[3];
            auVar147._8_8_ = 0;
            auVar147._0_8_ = local_60.n[0];
            auVar66._8_8_ = 0;
            auVar66._0_8_ = a[sVar208].z.n[4];
            auVar148._8_8_ = 0;
            auVar148._0_8_ = local_60.n[4];
            uVar197 = SUB168(auVar66 * auVar148,0);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = uVar197 & 0xfffffffffffff;
            auVar32 = auVar63 * auVar145 + auVar62 * auVar144 + auVar64 * auVar146 +
                      auVar65 * auVar147 + auVar67 * ZEXT816(0x1000003d10);
            uVar205 = auVar32._0_8_;
            auVar184._8_8_ = 0;
            auVar184._0_8_ = uVar205 >> 0x34 | auVar32._8_8_ << 0xc;
            auVar68._8_8_ = 0;
            auVar68._0_8_ = psVar199->n[0];
            auVar149._8_8_ = 0;
            auVar149._0_8_ = local_60.n[4];
            auVar69._8_8_ = 0;
            auVar69._0_8_ = a[sVar208].z.n[1];
            auVar150._8_8_ = 0;
            auVar150._0_8_ = local_60.n[3];
            auVar70._8_8_ = 0;
            auVar70._0_8_ = a[sVar208].z.n[2];
            auVar151._8_8_ = 0;
            auVar151._0_8_ = local_60.n[2];
            auVar71._8_8_ = 0;
            auVar71._0_8_ = a[sVar208].z.n[3];
            auVar152._8_8_ = 0;
            auVar152._0_8_ = local_60.n[1];
            auVar72._8_8_ = 0;
            auVar72._0_8_ = a[sVar208].z.n[4];
            auVar153._8_8_ = 0;
            auVar153._0_8_ = local_60.n[0];
            auVar73._8_8_ = 0;
            auVar73._0_8_ = uVar197 >> 0x34 | SUB168(auVar66 * auVar148,8) << 0xc;
            auVar32 = auVar68 * auVar149 + auVar184 + auVar69 * auVar150 + auVar70 * auVar151 +
                      auVar71 * auVar152 + auVar72 * auVar153 + auVar73 * ZEXT816(0x1000003d10);
            uVar197 = auVar32._0_8_;
            auVar185._8_8_ = 0;
            auVar185._0_8_ = uVar197 >> 0x34 | auVar32._8_8_ << 0xc;
            local_38 = (uVar197 & 0xfffffffffffff) >> 0x30;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = psVar199->n[0];
            auVar154._8_8_ = 0;
            auVar154._0_8_ = local_60.n[0];
            auVar75._8_8_ = 0;
            auVar75._0_8_ = a[sVar208].z.n[1];
            auVar155._8_8_ = 0;
            auVar155._0_8_ = local_60.n[4];
            auVar76._8_8_ = 0;
            auVar76._0_8_ = a[sVar208].z.n[2];
            auVar156._8_8_ = 0;
            auVar156._0_8_ = local_60.n[3];
            auVar77._8_8_ = 0;
            auVar77._0_8_ = a[sVar208].z.n[3];
            auVar157._8_8_ = 0;
            auVar157._0_8_ = local_60.n[2];
            auVar78._8_8_ = 0;
            auVar78._0_8_ = a[sVar208].z.n[4];
            auVar158._8_8_ = 0;
            auVar158._0_8_ = local_60.n[1];
            auVar32 = auVar75 * auVar155 + auVar185 + auVar76 * auVar156 + auVar77 * auVar157 +
                      auVar78 * auVar158;
            uVar198 = auVar32._0_8_;
            auVar187._8_8_ = 0;
            auVar187._0_8_ = uVar198 >> 0x34 | auVar32._8_8_ << 0xc;
            auVar159._8_8_ = 0;
            auVar159._0_8_ = (uVar198 & 0xfffffffffffff) << 4 | local_38;
            auVar32 = auVar74 * auVar154 + ZEXT816(0x1000003d1) * auVar159;
            uVar206 = auVar32._0_8_;
            auVar186._8_8_ = 0;
            auVar186._0_8_ = uVar206 >> 0x34 | auVar32._8_8_ << 0xc;
            auVar79._8_8_ = 0;
            auVar79._0_8_ = psVar199->n[0];
            auVar160._8_8_ = 0;
            auVar160._0_8_ = local_60.n[1];
            auVar80._8_8_ = 0;
            auVar80._0_8_ = a[sVar208].z.n[1];
            auVar161._8_8_ = 0;
            auVar161._0_8_ = local_60.n[0];
            auVar81._8_8_ = 0;
            auVar81._0_8_ = a[sVar208].z.n[2];
            auVar162._8_8_ = 0;
            auVar162._0_8_ = local_60.n[4];
            auVar82._8_8_ = 0;
            auVar82._0_8_ = a[sVar208].z.n[3];
            auVar163._8_8_ = 0;
            auVar163._0_8_ = local_60.n[3];
            auVar83._8_8_ = 0;
            auVar83._0_8_ = a[sVar208].z.n[4];
            auVar164._8_8_ = 0;
            auVar164._0_8_ = local_60.n[2];
            auVar2 = auVar81 * auVar162 + auVar187 + auVar82 * auVar163 + auVar83 * auVar164;
            uVar198 = auVar2._0_8_;
            auVar84._8_8_ = 0;
            auVar84._0_8_ = uVar198 & 0xfffffffffffff;
            auVar32 = auVar79 * auVar160 + auVar186 + auVar80 * auVar161 +
                      auVar84 * ZEXT816(0x1000003d10);
            uVar207 = auVar32._0_8_;
            auVar189._8_8_ = 0;
            auVar189._0_8_ = uVar198 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar188._8_8_ = 0;
            auVar188._0_8_ = uVar207 >> 0x34 | auVar32._8_8_ << 0xc;
            auVar85._8_8_ = 0;
            auVar85._0_8_ = psVar199->n[0];
            auVar165._8_8_ = 0;
            auVar165._0_8_ = local_60.n[2];
            auVar86._8_8_ = 0;
            auVar86._0_8_ = a[sVar208].z.n[1];
            auVar166._8_8_ = 0;
            auVar166._0_8_ = local_60.n[1];
            auVar87._8_8_ = 0;
            auVar87._0_8_ = a[sVar208].z.n[2];
            auVar167._8_8_ = 0;
            auVar167._0_8_ = local_60.n[0];
            auVar88._8_8_ = 0;
            auVar88._0_8_ = a[sVar208].z.n[3];
            auVar168._8_8_ = 0;
            auVar168._0_8_ = local_60.n[4];
            auVar89._8_8_ = 0;
            auVar89._0_8_ = a[sVar208].z.n[4];
            auVar169._8_8_ = 0;
            auVar169._0_8_ = local_60.n[3];
            auVar2 = auVar88 * auVar168 + auVar189 + auVar89 * auVar169;
            uVar198 = auVar2._0_8_;
            auVar90._8_8_ = 0;
            auVar90._0_8_ = uVar198 & 0xfffffffffffff;
            auVar32 = auVar85 * auVar165 + auVar188 + auVar86 * auVar166 + auVar87 * auVar167 +
                      auVar90 * ZEXT816(0x1000003d10);
            uVar194 = auVar32._0_8_;
            local_60.n[2] = uVar194 & 0xfffffffffffff;
            auVar190._8_8_ = 0;
            auVar190._0_8_ = (uVar194 >> 0x34 | auVar32._8_8_ << 0xc) + (uVar205 & 0xfffffffffffff);
            auVar91._8_8_ = 0;
            auVar91._0_8_ = uVar198 >> 0x34 | auVar2._8_8_ << 0xc;
            auVar190 = auVar91 * ZEXT816(0x1000003d10) + auVar190;
            uVar205 = auVar190._0_8_;
            local_60.n[3] = uVar205 & 0xfffffffffffff;
            local_60.n[4] = (uVar205 >> 0x34 | auVar190._8_8_ << 0xc) + (uVar197 & 0xffffffffffff);
            sVar208 = sVar200;
            local_60.n[0] = uVar206 & 0xfffffffffffff;
            local_60.n[1] = uVar207 & 0xfffffffffffff;
          }
          piVar201 = piVar201 + -0x20;
          psVar203 = psVar203 + -1;
        } while (sVar200 != 0);
        r[sVar208].x.n[4] = local_60.n[4];
        puVar1 = r[sVar208].x.n + 2;
        *puVar1 = local_60.n[2];
        puVar1[1] = local_60.n[3];
        r[sVar208].x.n[0] = local_60.n[0];
        r[sVar208].x.n[1] = local_60.n[1];
        if (len == 0) {
          return;
        }
      }
      do {
        if (a->infinity == 0) {
          secp256k1_ge_set_gej_zinv(r,a,&r->x);
        }
        r = r + 1;
        a = a + 1;
        len = len - 1;
      } while (len != 0);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;

    for (i = 0; i < len; i++) {
        secp256k1_gej_verify(&a[i]);
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
        secp256k1_ge_verify(&r[i]);
    }
}